

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

void Gia_ManFromIfGetConfig(Vec_Int_t *vConfigs,If_Man_t *pIfMan,If_Cut_t *pCutBest,int fCompl)

{
  If_DsdMan_t *p;
  int iVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int c;
  word *pwVar7;
  char *pcVar8;
  int *piVar9;
  If_Obj_t *pIVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  int Lit;
  bool bVar15;
  
  p = pIfMan->pIfDsdMan;
  iVar1 = If_CutDsdLit(pIfMan,pCutBest);
  pwVar7 = If_DsdManGetFuncConfig(p,iVar1);
  pcVar8 = If_CutDsdPerm(pIfMan,pCutBest);
  uVar2 = If_DsdManVarNum(pIfMan->pIfDsdMan);
  iVar3 = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
  iVar4 = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
  iVar5 = Vec_IntEntry(vConfigs,1);
  iVar1 = 0;
  if (0 < iVar5) {
    iVar1 = iVar5;
  }
  while (bVar15 = iVar1 != 0, iVar1 = iVar1 + -1, bVar15) {
    Vec_IntPush(vConfigs,0);
  }
  uVar6 = iVar4 / (int)uVar2;
  piVar9 = Vec_IntEntryP(vConfigs,vConfigs->nSize - iVar5);
  if (iVar4 % (int)uVar2 != 0) {
    __assert_fail("nPermBitNum % nVarNum == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                  ,0x5f4,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
  }
  uVar11 = 0;
  iVar1 = 0;
  if (0 < iVar3) {
    iVar1 = iVar3;
  }
  for (; iVar1 != (int)uVar11; uVar11 = (ulong)((int)uVar11 + 1)) {
    if ((pwVar7[(uVar11 >> 6) + 1] >> (uVar11 & 0x3f) & 1) != 0) {
      *(ulong *)(piVar9 + (uVar11 >> 6) * 2) =
           *(ulong *)(piVar9 + (uVar11 >> 6) * 2) | 1L << ((byte)uVar11 & 0x3f);
    }
  }
  uVar11 = 0;
  uVar14 = 0;
  if (0 < (int)uVar6) {
    uVar14 = uVar6;
  }
  iVar1 = iVar3;
  uVar13 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar13 = uVar11;
  }
  while( true ) {
    if (uVar11 == uVar13) {
      iVar4 = iVar4 + iVar3;
      if (iVar5 * 0x20 <= iVar4) {
        __assert_fail("nTtBitNum + nPermBitNum < 32 * nIntNum",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                      ,0x60b,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)"
                     );
      }
      iVar1 = If_CutDsdLit(pIfMan,pCutBest);
      uVar2 = Abc_LitIsCompl(iVar1);
      if ((*(uint *)&pCutBest->field_0x1c >> 0xc & 1 ^ uVar2) != fCompl) {
        *(ulong *)(piVar9 + (long)(iVar4 >> 6) * 2) =
             *(ulong *)(piVar9 + (long)(iVar4 >> 6) * 2) | 1L << ((byte)iVar4 & 0x3f);
      }
      Vec_IntAddToEntry(vConfigs,0,1);
      return;
    }
    uVar2 = (uint)(*pwVar7 >> ((char)uVar11 * '\x04' & 0x3fU));
    if ((uint)(byte)pCutBest->field_0x1f <= (uVar2 & 0xf)) break;
    Lit = (int)pcVar8[uVar2 & 0xf];
    uVar2 = Abc_Lit2Var(Lit);
    if ((byte)pCutBest->field_0x1f <= uVar2) {
      __assert_fail("Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                    ,0x601,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
    }
    uVar2 = Abc_Lit2Var(Lit);
    pIVar10 = If_ManObj(pIfMan,(int)(&pCutBest[1].Area)[uVar2]);
    c = Abc_LitIsCompl((pIVar10->field_22).iCopy);
    uVar2 = Abc_LitNotCond(Lit,c);
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      if ((uVar2 >> (uVar12 & 0x1f) & 1) != 0) {
        *(ulong *)(piVar9 + (long)((int)(iVar1 + uVar12) >> 6) * 2) =
             *(ulong *)(piVar9 + (long)((int)(iVar1 + uVar12) >> 6) * 2) |
             1L << ((byte)(iVar1 + uVar12) & 0x3f);
      }
    }
    uVar11 = uVar11 + 1;
    iVar1 = iVar1 + uVar6;
  }
  __assert_fail("Var < (int)pCutBest->nLeaves",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaIf.c"
                ,0x5fe,"void Gia_ManFromIfGetConfig(Vec_Int_t *, If_Man_t *, If_Cut_t *, int)");
}

Assistant:

void Gia_ManFromIfGetConfig( Vec_Int_t * vConfigs, If_Man_t * pIfMan, If_Cut_t * pCutBest, int fCompl )
{
    If_Obj_t * pIfObj;
    word * pPerm = If_DsdManGetFuncConfig( pIfMan->pIfDsdMan, If_CutDsdLit(pIfMan, pCutBest) ); // cell input -> DSD input
    char * pCutPerm = If_CutDsdPerm( pIfMan, pCutBest ); // DSD input -> cut input
    word * pArray;  int v, i, Lit, Var;
    int nVarNum = If_DsdManVarNum(pIfMan->pIfDsdMan);
    int nTtBitNum = If_DsdManTtBitNum(pIfMan->pIfDsdMan);
    int nPermBitNum = If_DsdManPermBitNum(pIfMan->pIfDsdMan);
    int nPermBitOne = nPermBitNum / nVarNum;
    // prepare storage
    int nIntNum = Vec_IntEntry( vConfigs, 1 );
    for ( i = 0; i < nIntNum; i++ )
        Vec_IntPush( vConfigs, 0 );
    pArray = (word *)Vec_IntEntryP( vConfigs, Vec_IntSize(vConfigs) - nIntNum );
    assert( nPermBitNum % nVarNum == 0 );
    // set truth table bits
    for ( i = 0; i < nTtBitNum; i++ )
        if ( Abc_TtGetBit(pPerm + 1, i) )
            Abc_TtSetBit( pArray, i );
    // set permutation bits
    for ( v = 0; v < nVarNum; v++ )
    {
        // get DSD variable
        Var = ((pPerm[0] >> (v * 4)) & 0xF);
        assert( Var < (int)pCutBest->nLeaves );
        // get AIG literal
        Lit = (int)pCutPerm[Var];
        assert( Abc_Lit2Var(Lit) < (int)pCutBest->nLeaves );
        // complement if polarity has changed
        pIfObj = If_ManObj( pIfMan, pCutBest->pLeaves[Abc_Lit2Var(Lit)] );
        Lit = Abc_LitNotCond( Lit, Abc_LitIsCompl(pIfObj->iCopy) );
        // create config literal
        for ( i = 0; i < nPermBitOne; i++ )
            if ( (Lit >> i) & 1 )
                Abc_TtSetBit( pArray, nTtBitNum + v * nPermBitOne + i );
    }
    // remember complementation
    assert( nTtBitNum + nPermBitNum < 32 * nIntNum );
    if ( Abc_LitIsCompl(If_CutDsdLit(pIfMan, pCutBest)) ^ pCutBest->fCompl ^ fCompl )
        Abc_TtSetBit( pArray, nTtBitNum + nPermBitNum );
    // update count
    Vec_IntAddToEntry( vConfigs, 0, 1 );
}